

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intcall.c
# Opt level: O1

void cause_interruptcall(uint atom_index)

{
  LispPTR *pLVar1;
  uint uVar2;
  DLword *pDVar3;
  DLword *pDVar4;
  short sVar5;
  int iVar6;
  DLword **ppDVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  
  MachineState.pvar[-9] = MachineState.pvar[-9] | 0x100;
  uVar9 = (long)MachineState.csp - (long)Stackspace >> 1;
  if (0xffff < uVar9) {
    printf("Stack offset is out of range: 0x%tx\n",uVar9);
  }
  MachineState.pvar[-5] = (short)uVar9 + 4;
  pLVar1 = (LispPTR *)(MachineState.csp + 2);
  MachineState.csp = MachineState.csp + 2;
  *pLVar1 = MachineState.tosvalue;
  MachineState.ivar = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
  MachineState.pvar[-6] = (short)MachineState.currentpc - (short)MachineState.currentfunc;
  if ((atom_index & 0xfff0000) == 0) {
    ppDVar7 = &AtomSpace;
    lVar10 = (ulong)(atom_index * 5) << 2;
  }
  else {
    if ((atom_index & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)atom_index);
    }
    ppDVar7 = &Lisp_world;
    lVar10 = (ulong)atom_index * 2;
  }
  pDVar3 = *ppDVar7;
  uVar2 = *(uint *)((long)pDVar3 + lVar10 + 8);
  uVar8 = uVar2 & 0xfffffff;
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar8);
  }
  pDVar4 = Lisp_world;
  if ((DLword *)CONCAT44(MachineState.endofstack._4_4_,(int)MachineState.endofstack) <
      MachineState.csp + (ulong)Lisp_world[(ulong)uVar8 + 1] + 0x20) {
    iVar6 = do_stackoverflow(1);
    if (iVar6 != 0) {
      pDVar3 = MachineState.csp;
      MachineState.csp = MachineState.csp + 2;
      pDVar3[2] = 0;
      pDVar3[3] = 0xe;
      contextsw(2,0xffff,1);
      return;
    }
  }
  MachineState.currentfunc = (fnhead *)(pDVar4 + uVar8);
  iVar6 = (int)(MachineState.currentfunc)->na;
  if (0 < (MachineState.currentfunc)->na) {
    do {
      pDVar4 = MachineState.csp;
      MachineState.csp = MachineState.csp + 2;
      pDVar4[2] = 0;
      pDVar4[3] = 0;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  MachineState.csp = MachineState.csp + 2;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0x8000;
  *(DLword *)((ulong)(MachineState.csp + 1) ^ 2) = MachineState.pvar[-5];
  MachineState.csp = MachineState.csp + 2;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xc000;
  uVar9 = (long)MachineState.pvar - (long)Stackspace >> 1;
  if (0xffff < uVar9) {
    printf("Stack offset is out of range: 0x%tx\n",uVar9);
  }
  *MachineState.csp = (short)uVar9 + 1;
  uVar9 = (long)MachineState.csp + (-4 - (long)Stackspace) >> 1;
  if (0xffff < uVar9) {
    printf("Stack offset is out of range: 0x%tx\n",uVar9);
  }
  MachineState.csp[9] = (DLword)uVar9;
  uVar9 = (long)MachineState.pvar - (long)Stackspace >> 1;
  if (0xffff < uVar9) {
    printf("Stack offset is out of range: 0x%tx\n",uVar9);
  }
  MachineState.csp[8] = (DLword)uVar9;
  MachineState.pvar = MachineState.csp + 10;
  *(uint *)(MachineState.csp + 2) = *(uint *)((long)pDVar3 + lVar10 + 8) & 0xfffffff;
  MachineState.csp = MachineState.pvar;
  if ((ushort)(MachineState.currentfunc)->pv < 0x7fff) {
    sVar5 = (MachineState.currentfunc)->pv + 2;
    do {
      pDVar3 = MachineState.csp;
      pDVar3[0] = 0xffff;
      pDVar3[1] = 0xffff;
      pDVar3 = MachineState.csp;
      MachineState.csp = MachineState.csp + 2;
      pDVar3[2] = 0xffff;
      pDVar3[3] = 0xffff;
      MachineState.csp = MachineState.csp + 2;
      sVar5 = sVar5 + -1;
    } while (1 < sVar5);
  }
  MachineState.currentpc =
       (ByteCode *)
       ((long)&(MachineState.currentfunc)->na + (ulong)(MachineState.currentfunc)->startpc);
  uVar9 = (long)MachineState.csp - (long)Stackspace >> 1;
  if (0xffff < uVar9) {
    printf("Stack offset is out of range: 0x%tx\n",uVar9);
  }
  MachineState.pvar[-5] = (DLword)uVar9;
  if ((ulong)(CONCAT44(MachineState.endofstack._4_4_,(int)MachineState.endofstack) -
             (long)MachineState.csp) < 2) {
    error("creating 0 length free stack block");
  }
  if (((int)MachineState.endofstack - (int)MachineState.csp & 2U) != 0) {
    error("creating odd length free stack block");
  }
  *(uint *)MachineState.csp =
       (uint)((int)MachineState.endofstack - (int)MachineState.csp) >> 1 & 0xffff | 0xa0000000;
  return;
}

Assistant:

void cause_interruptcall(unsigned int atom_index)
/* Atomindex for Function you want to invoke */
{
  struct definition_cell *defcell68k; /* Definition Cell PTR */
  short pv_num;                       /* scratch for pv */
  struct fnhead *tmp_fn;
  int rest; /* use for alignments */

  CURRENTFX->nopush = T;
  CURRENTFX->nextblock = StackOffsetFromNative(CurrentStackPTR) + 4;
  PushCStack; /* save TOS */

  /* Setup IVar */
  IVar = NativeAligned2FromStackOffset(CURRENTFX->nextblock);

  /* Set PC to the Next Instruction and save into pre-FX */
  CURRENTFX->pc = ((UNSIGNED)PC - (UNSIGNED)FuncObj);

  /* Get DEFCELL 68k address */
  defcell68k = (struct definition_cell *)GetDEFCELL68k(atom_index);

  /* Interrupt FN should be compiled code */
  tmp_fn = (struct fnhead *)NativeAligned4FromLAddr(defcell68k->defpointer);

  /* This used to be >=, but I think that was a change from earlier,
     when it was originally >.  I changed it back on 2/2/98 to see
     if that fixes stack overflow trouble.  --JDS */
  if ((UNSIGNED)(CurrentStackPTR + tmp_fn->stkmin + STK_SAFE) > (UNSIGNED)EndSTKP) {
    /*printf("Interrupt:$$ STKOVER when ");
    print(atom_index);
    printf(" was called  *****\n");*/
    DOSTACKOVERFLOW(0, -1);
  }
  FuncObj = tmp_fn;
  SWAPPED_FN_CHECK; /* Check for need to re-swap code stream */
  if (FuncObj->na >= 0) {
    /* This Function is Spread Type */
    /* Arguments on Stack Adjustment  */
    rest = 0 - (FuncObj->na);

    while (rest < 0) {
      PushStack(NIL_PTR);
      rest++;
    }
    CurrentStackPTR -= (rest << 1);
  } /* if end */

  /* Set up BF */
  CurrentStackPTR += 2;
  GETWORD(CurrentStackPTR) = BF_MARK;
  GETWORD(CurrentStackPTR + 1) = CURRENTFX->nextblock;
  CurrentStackPTR += 2;

  /* Set up FX */
  GETWORD(CurrentStackPTR) = FX_MARK;

  /* Now SET new FX */
  /* Make it SLOWP */
  ((FX *)CurrentStackPTR)->alink = StackOffsetFromNative(PVar) + 1;
  ((FX *)CurrentStackPTR)->blink = StackOffsetFromNative(DUMMYBF(CurrentStackPTR));
  ((FX *)CurrentStackPTR)->clink = StackOffsetFromNative(PVar);
  PVar = (DLword *)CurrentStackPTR + FRAMESIZE;
#ifdef BIGVM
  ((FX *)CurrentStackPTR)->fnheader = (defcell68k->defpointer);
#else
  ((FX *)CurrentStackPTR)->lofnheader = (defcell68k->defpointer) & 0x0ffff;
  ((FX *)CurrentStackPTR)->hi2fnheader = ((defcell68k->defpointer) & SEGMASK) >> 16;
#endif /* BIGVM */

  CurrentStackPTR = PVar;

  /* Set up PVar area */
  pv_num = FuncObj->pv + 1;
  while (pv_num > 0) {
    *((LispPTR *)CurrentStackPTR) = 0x0ffffffff;
    CurrentStackPTR += DLWORDSPER_CELL;
    *((LispPTR *)CurrentStackPTR) = 0x0ffffffff;
    CurrentStackPTR += DLWORDSPER_CELL;
    pv_num--;
  }

  /* Set PC points New Function's first OPCODE */
  PC = (ByteCode *)FuncObj + FuncObj->startpc;
  CURRENTFX->nextblock = StackOffsetFromNative(CurrentStackPTR);
  MAKEFREEBLOCK(CurrentStackPTR, ((UNSIGNED)EndSTKP - (UNSIGNED)CurrentStackPTR) >> 1);
}